

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void trc_apply_level_by_name(Curl_str *token,int lvl)

{
  int iVar1;
  ulong local_20;
  size_t i;
  int lvl_local;
  Curl_str *token_local;
  
  local_20 = 0;
  do {
    if (0xc < local_20) {
LAB_001307a1:
      local_20 = 0;
      while( true ) {
        if (8 < local_20) {
          return;
        }
        iVar1 = Curl_str_casecompare(token,(trc_feats[local_20].feat)->name);
        if (iVar1 != 0) break;
        local_20 = local_20 + 1;
      }
      (trc_feats[local_20].feat)->log_level = lvl;
      return;
    }
    iVar1 = Curl_str_casecompare(token,(trc_cfts[local_20].cft)->name);
    if (iVar1 != 0) {
      (trc_cfts[local_20].cft)->log_level = lvl;
      goto LAB_001307a1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static void trc_apply_level_by_name(struct Curl_str *token, int lvl)
{
  size_t i;

  for(i = 0; i < CURL_ARRAYSIZE(trc_cfts); ++i) {
    if(Curl_str_casecompare(token, trc_cfts[i].cft->name)) {
      trc_cfts[i].cft->log_level = lvl;
      break;
    }
  }
  for(i = 0; i < CURL_ARRAYSIZE(trc_feats); ++i) {
    if(Curl_str_casecompare(token, trc_feats[i].feat->name)) {
      trc_feats[i].feat->log_level = lvl;
      break;
    }
  }
}